

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Repeat.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Repeat::ArchiveOUT(ChFunction_Repeat *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Repeat>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_30._value = &this->fa;
  local_30._name = "fa";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->window_start;
  local_48._name = "window_start";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->window_length;
  local_60._name = "window_length";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->window_phase;
  local_78._name = "window_phase";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  return;
}

Assistant:

void ChFunction_Repeat::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Repeat>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(fa);
    marchive << CHNVP(window_start);
    marchive << CHNVP(window_length);
    marchive << CHNVP(window_phase);
}